

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::Cast_x86_avx2::forward(Cast_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  __m256 v0;
  __m128i v0_00;
  __m256 v1;
  __m256 v0_01;
  bool bVar2;
  unsigned_short uVar3;
  undefined1 (*pauVar4) [16];
  float *pfVar5;
  unsigned_short *puVar6;
  long in_RCX;
  long in_RSI;
  long *in_RDI;
  float fVar7;
  undefined8 uVar8;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar9 [32];
  undefined8 uVar12;
  int remain_3;
  int nn_3;
  unsigned_short *outptr_3;
  float *ptr_3;
  int q_3;
  int remain_2;
  int nn_2;
  float *outptr_2;
  unsigned_short *ptr_2;
  int q_2;
  __m256 fp32_3;
  m128i fp16_3;
  __m256 fp32_2;
  __m128i fp16_2;
  int i_3;
  float *outptr_1;
  unsigned_short *ptr_1;
  int q_1;
  int i_2;
  m256i mask_1;
  int remain_1;
  int nn_1;
  m128i fp16_1;
  __m256 fp32_1;
  __m128i fp16;
  __m256 fp32;
  int i_1;
  unsigned_short *outptr;
  float *ptr;
  int q;
  int i;
  m256i mask;
  int remain;
  int nn;
  int size;
  size_t out_elemsize;
  int elempack;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *in_stack_fffffffffffff888;
  undefined4 in_stack_fffffffffffff890;
  int in_stack_fffffffffffff894;
  int in_stack_fffffffffffff898;
  int in_stack_fffffffffffff89c;
  int _h;
  undefined8 in_stack_fffffffffffff8a0;
  int _w;
  Mat *pMVar13;
  Mat *in_stack_fffffffffffff8a8;
  Mat *in_stack_fffffffffffff8b0;
  int in_stack_fffffffffffff8b8;
  undefined4 uVar14;
  undefined4 in_stack_fffffffffffff8bc;
  undefined4 uVar15;
  Allocator *in_stack_fffffffffffff8c0;
  undefined1 (*in_stack_fffffffffffff8d0) [32];
  Mat *in_stack_fffffffffffff8d8;
  undefined1 (*in_stack_fffffffffffff8e0) [32];
  Mat *in_stack_fffffffffffff8e8;
  undefined1 (*in_stack_fffffffffffff8f0) [16];
  Mat *in_stack_fffffffffffff8f8;
  undefined1 (*in_stack_fffffffffffff900) [32];
  Mat *in_stack_fffffffffffff908;
  undefined1 (*in_stack_fffffffffffff910) [16];
  uint local_6c0;
  int local_6bc;
  Mat local_6b8;
  Mat *local_670;
  Mat local_668;
  float *local_620;
  int local_614;
  uint local_610;
  int local_60c;
  Mat local_608;
  undefined1 (*local_5c0) [32];
  Mat local_5b8;
  undefined1 (*local_570) [16];
  int local_564;
  undefined1 local_560 [32];
  undefined8 local_530;
  undefined8 uStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [16];
  int local_4ec;
  Mat local_4e8;
  undefined1 (*local_4a0) [32];
  Mat local_498;
  undefined1 (*local_450) [16];
  int local_448;
  int local_444;
  undefined1 local_440 [32];
  int local_418;
  int local_414;
  undefined1 local_410 [16];
  undefined1 local_400 [32];
  undefined1 local_3d0 [16];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  int local_39c;
  Mat local_398;
  undefined1 (*local_350) [16];
  Option *in_stack_fffffffffffffcc8;
  Mat *in_stack_fffffffffffffcd0;
  Mat *in_stack_fffffffffffffcd8;
  Cast *in_stack_fffffffffffffce0;
  undefined1 (*local_2f0) [32];
  int local_2e8;
  int local_2e4;
  undefined1 local_2e0 [32];
  int local_2a4;
  int local_2a0;
  uint local_29c;
  long local_298;
  int local_28c;
  long local_288;
  int local_27c;
  int local_278;
  int local_274;
  int local_270;
  int local_26c;
  long local_268;
  int local_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  float *local_200;
  float *local_1f8;
  float *local_1f0;
  undefined1 (*local_1e8) [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  Mat *local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined1 (*local_1a8) [16];
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 (*local_178) [32];
  undefined1 (*local_170) [16];
  undefined1 (*local_168) [16];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined1 local_140 [32];
  undefined1 (*local_108) [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 (*local_d8) [32];
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined1 (*local_68) [32];
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  Mat *local_38;
  
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) ==
      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4)) {
    ncnn::Mat::operator=
              ((Mat *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
               in_stack_fffffffffffff888);
    local_244 = 0;
  }
  else {
    local_26c = *(int *)(in_RSI + 0x2c);
    local_270 = *(int *)(in_RSI + 0x30);
    local_274 = *(int *)(in_RSI + 0x34);
    local_278 = *(int *)(in_RSI + 0x38);
    local_27c = *(int *)(in_RSI + 0x28);
    local_298 = *(long *)(in_RSI + 0x10);
    local_28c = *(int *)(in_RSI + 0x18);
    local_288 = local_298;
    local_268 = in_RCX;
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 3) {
        Cast::forward(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                      in_stack_fffffffffffffcc8);
      }
      local_298 = (long)(local_28c << 2);
    }
    else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 2) {
      local_298 = (long)(local_28c << 1);
    }
    else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) {
      local_298 = (long)local_28c;
    }
    else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 4) {
      local_298 = (long)(local_28c << 1);
    }
    _w = (int)((ulong)in_stack_fffffffffffff8a0 >> 0x20);
    if (local_27c == 1) {
      ncnn::Mat::create(in_stack_fffffffffffff8a8,_w,
                        CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                        in_stack_fffffffffffff894,(Allocator *)in_stack_fffffffffffff888);
    }
    else {
      _h = (int)in_stack_fffffffffffff8a0;
      if (local_27c == 2) {
        ncnn::Mat::create(in_stack_fffffffffffff8a8,_w,_h,
                          CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                          in_stack_fffffffffffff894,(Allocator *)in_stack_fffffffffffff888);
      }
      else if (local_27c == 3) {
        ncnn::Mat::create(in_stack_fffffffffffff8a8,_w,_h,in_stack_fffffffffffff89c,
                          CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                          (int)((ulong)in_stack_fffffffffffff888 >> 0x20),
                          (Allocator *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8)
                         );
      }
      else if (local_27c == 4) {
        in_stack_fffffffffffff888 = *(Mat **)(local_268 + 8);
        ncnn::Mat::create(in_stack_fffffffffffff8a8,_w,_h,in_stack_fffffffffffff89c,
                          in_stack_fffffffffffff898,
                          CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                          in_stack_fffffffffffff8b8,in_stack_fffffffffffff8c0);
      }
    }
    bVar2 = ncnn::Mat::empty(in_stack_fffffffffffff888);
    if (bVar2) {
      local_244 = -100;
    }
    else {
      local_29c = local_26c * local_270 * local_274 * local_28c;
      if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) &&
         (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 2)) {
        local_2a0 = (int)local_29c >> 3;
        local_2a4 = local_29c + local_2a0 * -8;
        local_220 = 0;
        uStack_218 = 0;
        uStack_210 = 0;
        uStack_208 = 0;
        local_2e0 = ZEXT1632(ZEXT816(0));
        for (local_2e4 = 0; local_2e4 < local_2a4; local_2e4 = local_2e4 + 1) {
          *(undefined4 *)(local_2e0 + (long)local_2e4 * 4) = 0x80000000;
        }
        for (local_2e8 = 0; local_2e8 < local_278; local_2e8 = local_2e8 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffff8b0,
                             (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
          local_2f0 = (undefined1 (*) [32])
                      ncnn::Mat::operator_cast_to_float_((Mat *)&stack0xfffffffffffffcc8);
          ncnn::Mat::~Mat((Mat *)0x8e171d);
          ncnn::Mat::channel(in_stack_fffffffffffff8b0,
                             (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
          pauVar4 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_unsigned_short_(&local_398);
          ncnn::Mat::~Mat((Mat *)0x8e1775);
          local_350 = pauVar4;
          for (local_39c = 0; local_39c < local_2a0; local_39c = local_39c + 1) {
            local_1e8 = local_2f0;
            local_3c0 = *(undefined8 *)*local_2f0;
            uStack_3b8 = *(undefined8 *)(*local_2f0 + 8);
            uStack_3b0 = *(undefined8 *)(*local_2f0 + 0x10);
            uStack_3a8 = *(undefined8 *)(*local_2f0 + 0x18);
            local_3d0 = vcvtps2ph_f16c(*local_2f0,3);
            local_1a8 = local_350;
            local_1c0 = local_3d0._0_8_;
            uStack_1b8 = local_3d0._8_8_;
            *local_350 = local_3d0;
            local_2f0 = local_2f0 + 1;
            local_350 = local_350 + 1;
          }
          if (0 < local_2a4) {
            local_178 = local_2f0;
            local_1a0 = local_2e0._0_8_;
            uStack_198 = local_2e0._8_8_;
            uStack_190 = local_2e0._16_8_;
            uStack_188 = local_2e0._24_8_;
            local_400 = vmaskmovps_avx(local_2e0,*local_2f0);
            local_410 = vcvtps2ph_f16c(local_400,3);
            memcpy(local_350,local_410,(long)local_2a4 << 1);
          }
        }
      }
      if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 2) &&
         (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1)) {
        local_414 = (int)local_29c >> 3;
        local_418 = local_29c + local_414 * -8;
        local_240 = 0;
        uStack_238 = 0;
        uStack_230 = 0;
        uStack_228 = 0;
        local_440 = ZEXT1632(ZEXT816(0));
        for (local_444 = 0; local_444 < local_418; local_444 = local_444 + 1) {
          *(undefined4 *)(local_440 + (long)local_444 * 4) = 0x80000000;
        }
        for (local_448 = 0; local_448 < local_278; local_448 = local_448 + 1) {
          in_stack_fffffffffffff908 = &local_498;
          ncnn::Mat::channel(in_stack_fffffffffffff8b0,
                             (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
          in_stack_fffffffffffff910 =
               (undefined1 (*) [16])
               ncnn::Mat::operator_cast_to_unsigned_short_(in_stack_fffffffffffff908);
          ncnn::Mat::~Mat((Mat *)0x8e1a71);
          in_stack_fffffffffffff8f8 = &local_4e8;
          local_450 = in_stack_fffffffffffff910;
          ncnn::Mat::channel(in_stack_fffffffffffff8b0,
                             (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
          in_stack_fffffffffffff900 =
               (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(in_stack_fffffffffffff8f8);
          ncnn::Mat::~Mat((Mat *)0x8e1ac3);
          local_4a0 = in_stack_fffffffffffff900;
          for (local_4ec = 0; local_4ec < local_414; local_4ec = local_4ec + 1) {
            local_168 = local_450;
            local_500 = vlddqu_avx(*local_450);
            local_150 = local_500._0_8_;
            uStack_148 = local_500._8_8_;
            local_520 = vcvtph2ps_f16c(local_500);
            local_d8 = local_4a0;
            local_100 = local_520._0_8_;
            uStack_f8 = local_520._8_8_;
            uStack_f0 = local_520._16_8_;
            uStack_e8 = local_520._24_8_;
            *local_4a0 = local_520;
            local_450 = local_450 + 1;
            local_4a0 = local_4a0 + 1;
          }
          if (0 < local_418) {
            local_d0 = 0;
            uStack_c8 = 0;
            local_530 = 0;
            uStack_528 = 0;
            memcpy(&local_530,local_450,(long)local_418 * 2);
            local_160 = local_530;
            uStack_158 = uStack_528;
            auVar1._8_8_ = uStack_528;
            auVar1._0_8_ = local_530;
            local_560 = vcvtph2ps_f16c(auVar1);
            local_68 = local_4a0;
            local_a0 = local_440._0_8_;
            uStack_98 = local_440._8_8_;
            uStack_90 = local_440._16_8_;
            uStack_88 = local_440._24_8_;
            local_c0 = local_560._0_8_;
            uStack_b8 = local_560._8_8_;
            uStack_b0 = local_560._16_8_;
            uStack_a8 = local_560._24_8_;
            auVar9 = vmaskmovps_avx(local_440,local_560);
            *local_4a0 = auVar9;
          }
        }
      }
      if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 4) &&
         (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1)) {
        for (local_564 = 0; local_564 < local_278; local_564 = local_564 + 1) {
          in_stack_fffffffffffff8e8 = &local_5b8;
          ncnn::Mat::channel(in_stack_fffffffffffff8b0,
                             (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
          in_stack_fffffffffffff8f0 =
               (undefined1 (*) [16])
               ncnn::Mat::operator_cast_to_unsigned_short_(in_stack_fffffffffffff8e8);
          ncnn::Mat::~Mat((Mat *)0x8e1d7a);
          in_stack_fffffffffffff8d8 = &local_608;
          local_570 = in_stack_fffffffffffff8f0;
          ncnn::Mat::channel(in_stack_fffffffffffff8b0,
                             (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
          in_stack_fffffffffffff8e0 =
               (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(in_stack_fffffffffffff8d8);
          ncnn::Mat::~Mat((Mat *)0x8e1dc6);
          local_610 = local_29c & 7;
          local_5c0 = in_stack_fffffffffffff8e0;
          for (local_60c = (int)local_29c >> 3; 0 < local_60c; local_60c = local_60c + -1) {
            local_170 = local_570;
            auVar1 = vlddqu_avx(*local_570);
            auVar9 = ZEXT1632(auVar1);
            v0_00[1] = (longlong)in_stack_fffffffffffff8e0;
            v0_00[0] = (longlong)in_stack_fffffffffffff8d8;
            in_stack_fffffffffffff8d0 = local_5c0;
            bfloat2float_avx(v0_00);
            *in_stack_fffffffffffff8d0 = auVar9;
            local_570 = local_570 + 1;
            local_5c0 = local_5c0 + 1;
            local_140 = auVar9;
            local_108 = in_stack_fffffffffffff8d0;
          }
          for (; 0 < (int)local_610; local_610 = local_610 - 1) {
            fVar7 = bfloat16_to_float32(*(unsigned_short *)*local_570);
            *(float *)*local_5c0 = fVar7;
            local_5c0 = (undefined1 (*) [32])((long)*local_5c0 + 4);
            local_570 = (undefined1 (*) [16])(*local_570 + 2);
          }
        }
      }
      if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) &&
         (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 4)) {
        for (local_614 = 0; local_614 < local_278; local_614 = local_614 + 1) {
          pMVar13 = &local_668;
          ncnn::Mat::channel(in_stack_fffffffffffff8b0,
                             (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
          pfVar5 = ncnn::Mat::operator_cast_to_float_(pMVar13);
          ncnn::Mat::~Mat((Mat *)0x8e2001);
          in_stack_fffffffffffff8b0 = &local_6b8;
          local_620 = pfVar5;
          ncnn::Mat::channel(in_stack_fffffffffffff8b0,
                             (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
          puVar6 = ncnn::Mat::operator_cast_to_unsigned_short_(in_stack_fffffffffffff8b0);
          uVar14 = SUB84(puVar6,0);
          uVar15 = (undefined4)((ulong)puVar6 >> 0x20);
          ncnn::Mat::~Mat((Mat *)0x8e204d);
          local_670 = (Mat *)CONCAT44(uVar15,uVar14);
          local_6c0 = local_29c & 0xf;
          for (local_6bc = (int)local_29c >> 4; 0 < local_6bc; local_6bc = local_6bc + -1) {
            local_1f0 = local_620;
            uVar8 = *(undefined8 *)local_620;
            uVar10 = *(undefined8 *)(local_620 + 2);
            uVar11 = *(undefined8 *)(local_620 + 4);
            uVar12 = *(undefined8 *)(local_620 + 6);
            local_1f8 = local_620 + 8;
            v0_01._8_8_ = in_stack_fffffffffffff900;
            v0_01._0_8_ = in_stack_fffffffffffff8f8;
            v0_01._16_8_ = in_stack_fffffffffffff908;
            v0_01._24_8_ = in_stack_fffffffffffff910;
            v1._8_8_ = in_stack_fffffffffffff8e0;
            v1._0_8_ = in_stack_fffffffffffff8d8;
            v1._16_8_ = in_stack_fffffffffffff8e8;
            v1._24_8_ = in_stack_fffffffffffff8f0;
            in_stack_fffffffffffff8a8 = local_670;
            float2bfloat_avx(v0_01,v1);
            in_stack_fffffffffffff8a8->data = (void *)uVar8;
            in_stack_fffffffffffff8a8->refcount = (int *)uVar10;
            in_stack_fffffffffffff8a8->elemsize = uVar11;
            in_stack_fffffffffffff8a8->elempack = (int)uVar12;
            *(int *)&in_stack_fffffffffffff8a8->field_0x1c = (int)((ulong)uVar12 >> 0x20);
            local_620 = local_620 + 0x10;
            local_670 = (Mat *)&local_670->allocator;
            local_60 = uVar8;
            uStack_58 = uVar10;
            uStack_50 = uVar11;
            uStack_48 = uVar12;
            local_38 = in_stack_fffffffffffff8a8;
          }
          if (7 < local_6c0) {
            local_6c0 = local_6c0 - 8;
            local_200 = local_620;
            uVar8 = *(undefined8 *)local_620;
            uVar10 = *(undefined8 *)(local_620 + 2);
            v0[1] = (float)uVar15;
            v0[0] = (float)uVar14;
            v0._8_8_ = pMVar13;
            v0._16_8_ = pfVar5;
            v0._24_8_ = in_stack_fffffffffffff8d0;
            pMVar13 = local_670;
            float2bfloat_avx(v0);
            pMVar13->data = (void *)uVar8;
            pMVar13->refcount = (int *)uVar10;
            local_620 = local_620 + 8;
            local_670 = (Mat *)&local_670->elemsize;
            local_1e0 = uVar8;
            uStack_1d8 = uVar10;
            local_1c8 = pMVar13;
          }
          for (; 0 < (int)local_6c0; local_6c0 = local_6c0 - 1) {
            uVar3 = float32_to_bfloat16(*local_620);
            *(unsigned_short *)&local_670->data = uVar3;
            local_670 = (Mat *)((long)&local_670->data + 2);
            local_620 = local_620 + 1;
          }
        }
      }
      local_244 = 0;
    }
  }
  return local_244;
}

Assistant:

int Cast_x86_avx2::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if __AVX2__
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;
    if (type_from == 1 && type_to == 2)
    {
        int nn = size >> 3;
        int remain = size - (nn << 3);
        m256i mask = {_mm256_setzero_si256()};
        for (int i = 0; i < remain; i++)
            mask.m256i_u32[i] = 0x80000000;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);

            for (int i = 0; i < nn; i++)
            {
                __m256 fp32 = _mm256_loadu_ps(ptr);
                __m128i fp16 = _mm256_cvtps_ph(fp32, _MM_FROUND_TRUNC);
                _mm_store_si128((__m128i*)outptr, fp16);
                ptr += 8;
                outptr += 8;
            }

            if (remain > 0)
            {
                __m256 fp32 = _mm256_maskload_ps(ptr, mask.vec);
                m128i fp16 = {_mm256_cvtps_ph(fp32, _MM_FROUND_TRUNC)};
                memcpy(outptr, fp16.m128i_u16, remain * sizeof(unsigned short));
            }
        }
    }

    if (type_from == 2 && type_to == 1)
    {
        int nn = size >> 3;
        int remain = size - (nn << 3);
        m256i mask = {_mm256_setzero_si256()};
        for (int i = 0; i < remain; i++)
            mask.m256i_u32[i] = 0x80000000;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < nn; i++)
            {
                __m128i fp16 = _mm_lddqu_si128((__m128i const*)ptr);
                __m256 fp32 = _mm256_cvtph_ps(fp16);
                _mm256_storeu_ps(outptr, fp32);
                ptr += 8;
                outptr += 8;
            }

            if (remain > 0)
            {
                m128i fp16 = {_mm_setzero_si128()};
                memcpy(fp16.m128i_u16, ptr, remain * sizeof(unsigned short));
                __m256 fp32 = _mm256_cvtph_ps(fp16.vec);
                _mm256_maskstore_ps(outptr, mask.vec, fp32);
            }
        }
    }
    if (type_from == 4 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            int nn = size >> 3;
            int remain = size & 7;
            for (; nn > 0; nn--)
            {
                _mm256_storeu_ps(outptr, bfloat2float_avx(_mm_lddqu_si128((__m128i const*)ptr)));
                ptr += 8;
                outptr += 8;
            }

            for (; remain > 0; remain--)
            {
                *outptr = bfloat16_to_float32(*ptr);
                outptr++;
                ptr++;
            }
        }
    }
    if (type_from == 1 && type_to == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);
            int nn = size >> 4;
            int remain = size & 15;
            for (; nn > 0; nn--)
            {
                _mm256_storeu_si256((__m256i*)outptr, float2bfloat_avx(_mm256_loadu_ps(ptr), _mm256_loadu_ps(ptr + 8)));
                ptr += 16;
                outptr += 16;
            }
            if (remain >= 8)
            {
                remain -= 8;
                _mm_store_si128((__m128i*)outptr, float2bfloat_avx(_mm256_loadu_ps(ptr)));
                ptr += 8;
                outptr += 8;
            }
            for (; remain > 0; remain--)
            {
                *outptr = float32_to_bfloat16(*ptr);
                outptr++;
                ptr++;
            }
        }
    }

    return 0;
#else // __AVX__

    return Cast::forward(bottom_blob, top_blob, opt);

#endif // __AVX__
}